

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O3

string * __thiscall
RigidBodyDynamics::Utils::GetNamedBodyOriginsOverview_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,Model *model)

{
  ostream *poVar1;
  ulong uVar2;
  uint body_id;
  ulong uVar3;
  string body_name;
  VectorNd Q;
  Vector3d position;
  stringstream result;
  string local_228;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_208;
  string *local_1f0;
  Vector3d *local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  Vector3d local_1d0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_1f0 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"");
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_228,_S_out|_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  local_208.m_storage.m_data = (double *)0x0;
  local_208.m_storage.m_rows = 0;
  if ((ulong)*(uint *)(this + 0x48) != 0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&local_208,(ulong)*(uint *)(this + 0x48),1);
    if (0 < local_208.m_storage.m_rows) {
      memset(local_208.m_storage.m_data,0,local_208.m_storage.m_rows << 3);
    }
  }
  UpdateKinematicsCustom((Model *)this,(VectorNd *)&local_208,(VectorNd *)0x0,(VectorNd *)0x0);
  if (*(long *)(this + 0x328) != *(long *)(this + 800)) {
    uVar3 = 0;
    do {
      body_id = (uint)uVar3;
      Model::GetBodyName_abi_cxx11_(&local_228,(Model *)this,body_id);
      if (local_228._M_string_length != 0) {
        local_1e8 = (Vector3d *)0x0;
        uStack_1e0 = 0;
        local_1d8 = 0;
        CalcBodyToBaseCoordinates
                  (&local_1d0,(Model *)this,(VectorNd *)&local_208,body_id,(Vector3d *)&local_1e8,
                   false);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
        local_1e8 = &local_1d0;
        poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                           *)&local_1e8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      uVar3 = (ulong)(body_id + 1);
      uVar2 = (*(long *)(this + 0x328) - *(long *)(this + 800) >> 4) * 0x6db6db6db6db6db7;
    } while (uVar3 <= uVar2 && uVar2 - uVar3 != 0);
  }
  std::__cxx11::stringbuf::str();
  free(local_208.m_storage.m_data);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return local_1f0;
}

Assistant:

RBDL_DLLAPI std::string GetNamedBodyOriginsOverview (Model &model)
{
  stringstream result ("");

  VectorNd Q (VectorNd::Zero(model.dof_count));
  UpdateKinematicsCustom (model, &Q, NULL, NULL);

  for (unsigned int body_id = 0; body_id < model.mBodies.size(); body_id++) {
    std::string body_name = model.GetBodyName (body_id);

    if (body_name.size() == 0) {
      continue;
    }

    Vector3d position = CalcBodyToBaseCoordinates (model, Q, body_id, Vector3d (0.,
                        0., 0.), false);

    result << body_name << ": " << position.transpose() << endl;
  }

  return result.str();
}